

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

void __thiscall
notch::io::PlainTextNetworkWriter::saveWeightsAndBias
          (PlainTextNetworkWriter *this,Array *weights,Array *bias)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = bias->_M_size;
  uVar2 = weights->_M_size;
  lVar5 = 0;
  uVar3 = uVar2 / uVar1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"   ",3);
    std::__ostream_insert<char,std::char_traits<char>>(this->out," ",1);
    std::ostream::_M_insert<double>((double)bias->_M_data[lVar5]);
    if (uVar1 <= uVar2) {
      uVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(this->out," ",1);
        std::ostream::_M_insert<double>((double)weights->_M_data[lVar5 * uVar3 + uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"\n",1);
    lVar5 = lVar5 + 1;
  } while (lVar5 != uVar1 + (uVar1 == 0));
  return;
}

Assistant:

void saveWeightsAndBias(const Array &weights, const Array &bias) {
        size_t nOutputs = bias.size();
        size_t nInputs = weights.size() / nOutputs;
        for (size_t r = 0; r < nOutputs; ++r) {
            out << "   ";
            out << " " << bias[r];
            for (size_t c = 0; c < nInputs; ++c) {
                out << " " << weights[r*nInputs + c];
            }
            out << "\n";
        }
    }